

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.cpp
# Opt level: O0

char * soul::getInterpolationDescription(InterpolationType type)

{
  char *pcStack_10;
  InterpolationType type_local;
  
  switch(type) {
  case none:
    pcStack_10 = "none";
    break;
  case latch:
    pcStack_10 = "latch";
    break;
  case linear:
    pcStack_10 = "linear";
    break;
  case sinc:
    pcStack_10 = "sinc";
    break;
  case fast:
    pcStack_10 = "fast";
    break;
  case best:
    pcStack_10 = "best";
    break;
  default:
    throwInternalCompilerError("getInterpolationDescription",0x54);
  }
  return pcStack_10;
}

Assistant:

const char* getInterpolationDescription (InterpolationType type)
{
    switch (type)
    {
        case InterpolationType::none:    return "none";
        case InterpolationType::latch:   return "latch";
        case InterpolationType::linear:  return "linear";
        case InterpolationType::sinc:    return "sinc";
        case InterpolationType::fast:    return "fast";
        case InterpolationType::best:    return "best";
    }

    SOUL_ASSERT_FALSE;
    return "";
}